

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O3

void u8_to_u_test(int line,UTF_S8 *str1,UTF_US16 *str2,bool ok)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  char16_t *pcVar4;
  size_type sVar5;
  byte *pbVar6;
  byte *pbVar7;
  long lVar8;
  char16_t cVar9;
  ulong uVar10;
  ushort uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  UTF_US16 tmp;
  UTF_UC16 buf [256];
  byte abStack_24c [4];
  UTF_US16 local_248;
  char16_t local_228 [256];
  
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = L'\0';
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  bVar3 = UTF_u8_to_u<(char)63>((UTF_US8 *)str1,&local_248);
  UTF_test(line,bVar3 == ok);
  uVar2 = str2->_M_string_length;
  sVar5 = local_248._M_string_length;
  if (uVar2 < local_248._M_string_length) {
    sVar5 = uVar2;
  }
  if (sVar5 != 0) {
    uVar10 = 0;
    do {
      if ((str2->_M_dataplus)._M_p[uVar10] != local_248._M_dataplus._M_p[uVar10]) {
        bVar3 = false;
        goto LAB_00101408;
      }
      uVar10 = uVar10 + 1;
    } while (sVar5 != uVar10);
  }
  bVar3 = local_248._M_string_length == uVar2;
LAB_00101408:
  UTF_test(line,bVar3);
  bVar3 = true;
  if (str1->_M_string_length == 0) {
    pcVar4 = local_228;
  }
  else {
    pbVar7 = (byte *)(str1->_M_dataplus)._M_p;
    pbVar6 = pbVar7 + str1->_M_string_length;
    pcVar4 = local_228;
    lVar8 = 0;
    do {
      bVar1 = *pbVar7;
      uVar12 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        lVar14 = 2;
        if ((((byte)(bVar1 + 0x3e) < 0x1e) || (lVar14 = 3, (bVar1 & 0xf0) == 0xe0)) ||
           (lVar14 = 4, (bVar1 & 0xf8) == 0xf0)) {
          lVar16 = 1;
          do {
            pbVar7 = pbVar7 + 1;
            if (pbVar7 == pbVar6) {
              if (lVar8 == 0x1fe) goto LAB_00101659;
              *pcVar4 = L'?';
              pcVar4 = pcVar4 + 1;
              goto LAB_0010166d;
            }
            abStack_24c[lVar16] = *pbVar7;
            lVar16 = lVar16 + 1;
          } while (lVar14 != lVar16);
          if ((byte)(bVar1 + 0x3e) < 0x1e) {
            if (((char)abStack_24c[1] < -0x40) && ((bVar1 & 0x1e) != 0)) {
              uVar12 = abStack_24c[1] & 0x3f | (uVar12 & 0x1f) << 6;
              goto LAB_00101437;
            }
          }
          else if ((bVar1 & 0xf0) == 0xe0) {
            if (((char)abStack_24c[1] < -0x40) && ((char)abStack_24c[2] < -0x40)) {
              if ((abStack_24c[1] & 0x20) != 0 || (char)(uVar12 & 0xf) != '\0') {
                uVar12 = abStack_24c[2] & 0x3f |
                         (abStack_24c[1] & 0x3f) << 6 | (uVar12 & 0xf) << 0xc;
                goto LAB_00101437;
              }
            }
          }
          else if ((((bVar1 & 0xf8) == 0xf0) && ((char)abStack_24c[1] < -0x40)) &&
                  (((char)abStack_24c[2] < -0x40 && ((char)abStack_24c[3] < -0x40)))) {
            if (((abStack_24c[1] & 0x30) != 0 || (bVar1 & 7) != 0) &&
               (uVar15 = (abStack_24c[1] & 0x3f) << 0xc | (uint)(bVar1 & 7) << 0x12,
               uVar15 < 0x110000)) {
              uVar13 = abStack_24c[3] & 0x3f | (abStack_24c[2] & 0x3f) << 6;
              uVar12 = uVar13 + uVar15;
              if (uVar15 < 0x10000) goto LAB_00101437;
              cVar9 = (short)(uVar12 + 0x3ff0000 >> 10) + L'\xd800';
              uVar11 = (ushort)uVar13 | 0xdc00;
              goto LAB_0010143d;
            }
          }
          cVar9 = L'?';
          uVar11 = 0;
          goto LAB_0010143d;
        }
        if (lVar8 != 0x1fe) {
          *pcVar4 = L'?';
          lVar14 = lVar8 + 2;
          goto LAB_00101472;
        }
LAB_00101659:
        bVar3 = false;
        break;
      }
LAB_00101437:
      cVar9 = (char16_t)uVar12;
      uVar11 = 0;
LAB_0010143d:
      if (lVar8 == 0x1fe) goto LAB_00101659;
      *pcVar4 = cVar9;
      lVar14 = lVar8 + 2;
      if (uVar11 != 0) {
        if (lVar8 + 2 == 0x1fe) {
          pcVar4 = (char16_t *)((long)local_228 + lVar8 + 2);
          goto LAB_00101659;
        }
        *(ushort *)((long)local_228 + lVar8 + 2) = uVar11;
        lVar14 = lVar8 + 4;
      }
LAB_00101472:
      lVar8 = lVar14;
      pbVar7 = pbVar7 + 1;
      pcVar4 = (char16_t *)((long)local_228 + lVar8);
    } while (pbVar7 != pbVar6);
  }
LAB_0010166d:
  *pcVar4 = L'\0';
  UTF_test(line,bVar3);
  cVar9 = *local_248._M_dataplus._M_p;
  if (cVar9 == L'\0') {
    pcVar4 = local_228;
  }
  else {
    pcVar4 = local_228;
    lVar8 = 0;
    do {
      if (*pcVar4 == L'\0') goto LAB_001016ce;
      bVar3 = local_248._M_string_length + 1 == lVar8;
      if ((cVar9 != *pcVar4) || (local_248._M_string_length + 1 == lVar8)) goto LAB_001016d5;
      pcVar4 = pcVar4 + 1;
      cVar9 = local_248._M_dataplus._M_p[lVar8 + 1];
      lVar8 = lVar8 + 1;
    } while (cVar9 != L'\0');
  }
  cVar9 = L'\0';
LAB_001016ce:
  bVar3 = cVar9 == *pcVar4;
LAB_001016d5:
  UTF_test(line,bVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  return;
}

Assistant:

void u8_to_u_test(int line, const UTF_S8& str1, const UTF_US16& str2, bool ok)
{
    UTF_US16 tmp;
    UTF_UC16 buf[256];
    UTF_test(line, UTF_u8_to_u<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == str2);
    UTF_test(line, UTF_j8_to_uj16(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj16_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}